

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

nk_uint * nk_add_value(nk_context *ctx,nk_window *win,nk_hash name,nk_uint value)

{
  uint uVar1;
  nk_table *pnVar2;
  nk_page_element *ptr;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                  ,0x3c80,
                  "nk_uint *nk_add_value(struct nk_context *, struct nk_window *, nk_hash, nk_uint)"
                 );
  }
  if (win != (nk_window *)0x0) {
    if ((win->tables == (nk_table *)0x0) || (0x3a < win->tables->size)) {
      ptr = nk_create_page_element(ctx);
      nk_zero(ptr,0x200);
      pnVar2 = win->tables;
      if (pnVar2 == (nk_table *)0x0) {
        win->tables = (nk_table *)ptr;
        (ptr->data).tbl.size = 0;
        (ptr->data).tbl.next = (nk_table *)0x0;
        (ptr->data).tbl.prev = (nk_table *)0x0;
        win->table_count = 1;
      }
      else {
        pnVar2->prev = (nk_table *)ptr;
        (ptr->data).tbl.next = pnVar2;
        (ptr->data).tbl.prev = (nk_table *)0x0;
        (ptr->data).tbl.size = 0;
        win->tables = (nk_table *)ptr;
        win->table_count = win->table_count + 1;
      }
    }
    pnVar2 = win->tables;
    pnVar2->seq = win->seq;
    uVar1 = pnVar2->size;
    pnVar2->keys[uVar1] = name;
    pnVar2->values[uVar1] = 0;
    pnVar2->size = uVar1 + 1;
    return pnVar2->values + uVar1;
  }
  __assert_fail("win",
                "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h",
                0x3c81,
                "nk_uint *nk_add_value(struct nk_context *, struct nk_window *, nk_hash, nk_uint)");
}

Assistant:

NK_LIB nk_uint*
nk_add_value(struct nk_context *ctx, struct nk_window *win,
            nk_hash name, nk_uint value)
{
    NK_ASSERT(ctx);
    NK_ASSERT(win);
    if (!win || !ctx) return 0;
    if (!win->tables || win->tables->size >= NK_VALUE_PAGE_CAPACITY) {
        struct nk_table *tbl = nk_create_table(ctx);
        NK_ASSERT(tbl);
        if (!tbl) return 0;
        nk_push_table(win, tbl);
    }
    win->tables->seq = win->seq;
    win->tables->keys[win->tables->size] = name;
    win->tables->values[win->tables->size] = value;
    return &win->tables->values[win->tables->size++];
}